

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O3

void av1_cyclic_refresh_update_segment
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int64_t rate,
               int64_t dist,int skip,RUN_TYPE dry_run)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  CYCLIC_REFRESH *pCVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  size_t __n;
  undefined7 in_register_00000081;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  
  pMVar5 = *(x->e_mbd).mi;
  pCVar6 = cpi->cyclic_refresh;
  uVar16 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  iVar4 = (cpi->common).mi_params.mi_cols;
  uVar14 = iVar4 - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [uVar16] <= (int)uVar14) {
    uVar14 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar16];
  }
  uVar17 = (cpi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar16] <= (int)uVar17) {
    uVar17 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar16];
  }
  if ((cpi->noise_estimate).enabled == 0) {
    if (pMVar5->ref_frame[1] < '\x01') goto LAB_003ae700;
LAB_003ae6fa:
    uVar9 = 2;
  }
  else {
    if (pMVar5->ref_frame[1] < '\x01') {
LAB_003ae700:
      if (pCVar6->thresh_dist_sb < dist) {
        sVar2 = pMVar5->mv[0].as_mv.row;
        sVar3 = pCVar6->motion_thresh;
        iVar13 = (int)sVar3;
        bVar7 = true;
        if (sVar2 <= sVar3) {
          uVar9 = 0;
          if (((SBORROW4((int)sVar2,-iVar13) != sVar2 + iVar13 < 0) ||
              (sVar2 = pMVar5->mv[0].as_mv.col, sVar3 < sVar2)) ||
             (SBORROW4((int)sVar2,-iVar13) != sVar2 + iVar13 < 0)) goto LAB_003ae77e;
          if (((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0]))
          goto LAB_003ae750;
        }
        uVar9 = 0;
        goto LAB_003ae77e;
      }
    }
    else if ((int)(cpi->noise_estimate).level < 2) goto LAB_003ae6fa;
LAB_003ae750:
    if ((((BLOCK_16X8 < bsize) && (rate < pCVar6->thresh_rate_sb)) &&
        (((pMVar5->field_0xa7 & 0x80) != 0 || ('\0' < pMVar5->ref_frame[0])))) &&
       ((pMVar5->mv[0].as_int == 0 && (10 < pCVar6->rate_boost_fac)))) goto LAB_003ae6fa;
    uVar9 = 1;
  }
  bVar7 = false;
LAB_003ae77e:
  lVar15 = 2 - (ulong)(pCVar6->skip_over4x4 == 0);
  lVar12 = (long)(iVar4 * mi_row + mi_col);
  bVar1 = pCVar6->map[lVar12];
  uVar11 = (uint)*(ushort *)&pMVar5->field_0xa7;
  if (0xfffffffd < (uVar11 & 7) - 3) {
    if (skip != 0) {
      uVar9 = 0;
    }
    uVar11 = uVar9 | *(ushort *)&pMVar5->field_0xa7 & 0xfffffff8;
    *(short *)&pMVar5->field_0xa7 = (short)uVar11;
  }
  bVar10 = (byte)uVar11 & 7;
  if ((uVar11 & 7) - 3 < 0xfffffffe) {
    bVar8 = 1;
    if ((!bVar7) && (bVar8 = bVar1, pCVar6->map[lVar12] == '\x01')) {
      bVar8 = 0;
    }
  }
  else {
    bVar8 = -(char)pCVar6->time_for_refresh;
  }
  uVar9 = (uint)bVar10;
  if (0 < (int)uVar17) {
    iVar4 = (cpi->common).mi_params.mi_cols;
    __n = (size_t)(int)uVar14;
    uVar16 = 0;
    do {
      memset(pCVar6->map + lVar12,(uint)bVar8,__n);
      memset((cpi->enc_seg).map + lVar12,uVar9,__n);
      memset(((cpi->common).cur_frame)->seg_map + lVar12,uVar9,__n);
      uVar16 = uVar16 + lVar15;
      lVar12 = lVar12 + iVar4 * lVar15;
    } while (uVar16 < uVar17);
  }
  if (dry_run == '\0') {
    if (bVar10 == 2) {
      x->actual_num_seg2_blocks = x->actual_num_seg2_blocks + uVar17 * uVar14;
    }
    else if (uVar9 == 1) {
      x->actual_num_seg1_blocks = x->actual_num_seg1_blocks + uVar17 * uVar14;
    }
  }
  return;
}

Assistant:

void av1_cyclic_refresh_update_segment(const AV1_COMP *cpi, MACROBLOCK *const x,
                                       int mi_row, int mi_col, BLOCK_SIZE bsize,
                                       int64_t rate, int64_t dist, int skip,
                                       RUN_TYPE dry_run) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
  const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
  int noise_level = 0;
  if (cpi->noise_estimate.enabled) noise_level = cpi->noise_estimate.level;
  const int refresh_this_block =
      candidate_refresh_aq(cr, mbmi, rate, dist, bsize, noise_level);
  int sh = cpi->cyclic_refresh->skip_over4x4 ? 2 : 1;
  // Default is to not update the refresh map.
  int new_map_value = cr->map[block_index];

  // If this block is labeled for refresh, check if we should reset the
  // segment_id.
  if (cyclic_refresh_segment_id_boosted(mbmi->segment_id)) {
    mbmi->segment_id = refresh_this_block;
    // Reset segment_id if will be skipped.
    if (skip) mbmi->segment_id = CR_SEGMENT_ID_BASE;
  }
  const uint8_t segment_id = mbmi->segment_id;

  // Update the cyclic refresh map, to be used for setting segmentation map
  // for the next frame. If the block  will be refreshed this frame, mark it
  // as clean. The magnitude of the -ve influences how long before we consider
  // it for refresh again.
  if (cyclic_refresh_segment_id_boosted(segment_id)) {
    new_map_value = -cr->time_for_refresh;
  } else if (refresh_this_block) {
    // Else if it is accepted as candidate for refresh, and has not already
    // been refreshed (marked as 1) then mark it as a candidate for cleanup
    // for future time (marked as 0), otherwise don't update it.
    if (cr->map[block_index] == 1) new_map_value = 0;
  } else {
    // Leave it marked as block that is not candidate for refresh.
    new_map_value = 1;
  }

  // Update entries in the cyclic refresh map with new_map_value, and
  // copy mbmi->segment_id into global segmentation map.
  const int mi_stride = cm->mi_params.mi_cols;
  for (int mi_y = 0; mi_y < ymis; mi_y += sh) {
    const int map_offset = block_index + mi_y * mi_stride;
    memset(&cr->map[map_offset], new_map_value, xmis);
    memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
    memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
  }

  // Accumulate cyclic refresh update counters.
  if (!dry_run) {
    if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks += xmis * ymis;
    else if (cyclic_refresh_segment_id(segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks += xmis * ymis;
  }
}